

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::ParsedNumber::populateFormattable
          (ParsedNumber *this,Formattable *output,parse_flags_t parseFlags)

{
  uint uVar1;
  bool bVar2;
  DecimalQuantity *this_00;
  Formattable *size;
  double d;
  
  uVar1 = this->flags;
  if ((uVar1 & 0x40) == 0) {
    if (-1 < (char)uVar1) {
      size = output;
      bVar2 = icu_63::number::impl::DecimalQuantity::isZero(&this->quantity);
      if (bVar2) {
        bVar2 = icu_63::number::impl::DecimalQuantity::isNegative(&this->quantity);
        if (bVar2 && (char)((parseFlags & 0x10U) >> 4) == '\0') {
          d = -0.0;
          goto LAB_00266ac1;
        }
      }
      this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,(size_t)size);
      if (this_00 != (DecimalQuantity *)0x0) {
        icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00,&this->quantity);
      }
      Formattable::adoptDecimalQuantity(output,this_00);
      return;
    }
    if ((uVar1 & 1) == 0) {
      d = INFINITY;
    }
    else {
      d = -INFINITY;
    }
  }
  else {
    d = uprv_getNaN_63();
  }
LAB_00266ac1:
  Formattable::setDouble(output,d);
  return;
}

Assistant:

void ParsedNumber::populateFormattable(Formattable& output, parse_flags_t parseFlags) const {
    bool sawNaN = 0 != (flags & FLAG_NAN);
    bool sawInfinity = 0 != (flags & FLAG_INFINITY);
    bool integerOnly = 0 != (parseFlags & PARSE_FLAG_INTEGER_ONLY);

    // Check for NaN, infinity, and -0.0
    if (sawNaN) {
        // Can't use NAN or std::nan because the byte pattern is platform-dependent;
        // MSVC sets the sign bit, but Clang and GCC do not
        output.setDouble(uprv_getNaN());
        return;
    }
    if (sawInfinity) {
        if (0 != (flags & FLAG_NEGATIVE)) {
            output.setDouble(-INFINITY);
            return;
        } else {
            output.setDouble(INFINITY);
            return;
        }
    }
    U_ASSERT(!quantity.bogus);
    if (quantity.isZero() && quantity.isNegative() && !integerOnly) {
        output.setDouble(-0.0);
        return;
    }

    // All other numbers
    output.adoptDecimalQuantity(new DecimalQuantity(quantity));
}